

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

char * lj_debug_uvnamev(cTValue *o,uint32_t idx,TValue **tvp,GCobj **op)

{
  char cVar1;
  TValue *pTVar2;
  GCobj *pGVar3;
  char *pcVar4;
  
  if ((o->field_4).it >> 0xf != 0x1fff7) {
    return (char *)0x0;
  }
  pGVar3 = (GCobj *)((ulong)o->field_4 & 0x7fffffffffff);
  if ((pGVar3->gch).unused1 == '\0') {
    pTVar2 = (pGVar3->th).base;
    if (*(byte *)((long)pTVar2 + -0x2c) <= idx) {
      return (char *)0x0;
    }
    pGVar3 = *(GCobj **)((long)pGVar3 + (ulong)idx * 8 + 0x28);
    *tvp = (TValue *)(pGVar3->gch).metatable.gcptr64;
    *op = pGVar3;
    pcVar4 = (char *)pTVar2[-2].u64;
    if (pcVar4 != (char *)0x0) {
      if (idx != 0) {
        do {
          do {
            cVar1 = *pcVar4;
            pcVar4 = pcVar4 + 1;
          } while (cVar1 != '\0');
          idx = idx - 1;
        } while (idx != 0);
      }
      return pcVar4;
    }
  }
  else {
    if ((pGVar3->gch).unused2 <= idx) {
      return (char *)0x0;
    }
    *tvp = (TValue *)((long)pGVar3 + (ulong)idx * 8 + 0x30);
    *op = pGVar3;
  }
  return "";
}

Assistant:

const char *lj_debug_uvnamev(cTValue *o, uint32_t idx, TValue **tvp, GCobj **op)
{
  if (tvisfunc(o)) {
    GCfunc *fn = funcV(o);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      if (idx < pt->sizeuv) {
	GCobj *uvo = gcref(fn->l.uvptr[idx]);
	*tvp = uvval(&uvo->uv);
	*op = uvo;
	return lj_debug_uvname(pt, idx);
      }
    } else {
      if (idx < fn->c.nupvalues) {
	*tvp = &fn->c.upvalue[idx];
	*op = obj2gco(fn);
	return "";
      }
    }
  }
  return NULL;
}